

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O0

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  float fVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  double dVar7;
  double dVar8;
  single_landmark_s *psVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double measProb;
  double y_mu;
  double x_mu;
  double y_meas;
  double x_meas;
  double cur_dist_squared;
  double y_lm;
  double x_lm;
  single_landmark_s *cur_lm;
  const_reference pvStack_d0;
  uint k;
  single_landmark_s *closestLm;
  double min_dist_squared;
  LandmarkObs *cur_mea_map;
  uint j_1;
  undefined1 local_a8 [8];
  LandmarkObs cur_meas_map;
  LandmarkObs *cur_meas_veh;
  undefined1 local_80 [4];
  uint j;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> meas_map;
  double yParticle;
  double xParticle;
  double sinThetaParticle;
  double cosThetaParticle;
  Particle *cur_particle;
  uint i;
  double sensor_range_squared;
  Map *map_landmarks_local;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_local;
  double *std_landmark_local;
  double sensor_range_local;
  ParticleFilter *this_local;
  
  for (cur_particle._4_4_ = 0; cur_particle._4_4_ < this->num_particles;
      cur_particle._4_4_ = cur_particle._4_4_ + 1) {
    pvVar2 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(ulong)cur_particle._4_4_);
    dVar7 = cos(pvVar2->theta);
    dVar8 = sin(pvVar2->theta);
    dVar12 = pvVar2->x;
    meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar2->y;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_80);
    cur_meas_veh._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size(observations);
      if (sVar3 <= cur_meas_veh._4_4_) break;
      cur_meas_map.y =
           (double)std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                             (observations,(ulong)cur_meas_veh._4_4_);
      cur_meas_map._0_8_ =
           (((const_reference)cur_meas_map.y)->x * dVar7 + dVar12) -
           ((const_reference)cur_meas_map.y)->y * dVar8;
      cur_meas_map.x =
           ((const_reference)cur_meas_map.y)->y * dVar7 +
           ((const_reference)cur_meas_map.y)->x * dVar8 +
           (double)meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_80,
                 (value_type *)local_a8);
      cur_meas_veh._4_4_ = cur_meas_veh._4_4_ + 1;
    }
    pvVar2->weight = 1.0;
    cur_mea_map._0_4_ = 0;
    while( true ) {
      sVar3 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size
                        ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_80);
      if (sVar3 <= (uint)cur_mea_map) break;
      pvVar4 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_80,
                          (ulong)(uint)cur_mea_map);
      pvStack_d0 = (const_reference)0x0;
      cur_lm._4_4_ = 0;
      closestLm = (single_landmark_s *)(sensor_range * sensor_range);
      while( true ) {
        sVar3 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::size
                          (&map_landmarks->landmark_list);
        if (sVar3 <= cur_lm._4_4_) break;
        pvVar5 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::
                 operator[](&map_landmarks->landmark_list,(ulong)cur_lm._4_4_);
        psVar9 = (single_landmark_s *)
                 distSquared(pvVar4->x,pvVar4->y,(double)pvVar5->x_f,(double)pvVar5->y_f);
        if ((double)psVar9 < (double)closestLm) {
          pvStack_d0 = pvVar5;
          closestLm = psVar9;
        }
        cur_lm._4_4_ = cur_lm._4_4_ + 1;
      }
      if (pvStack_d0 != (const_reference)0x0) {
        dVar12 = pvVar4->y;
        fVar1 = pvStack_d0->y_f;
        dVar7 = *std_landmark;
        dVar8 = std_landmark[1];
        dVar10 = pow(pvVar4->x - (double)pvStack_d0->x_f,2.0);
        dVar11 = pow(*std_landmark,2.0);
        dVar12 = pow(dVar12 - (double)fVar1,2.0);
        dVar13 = pow(std_landmark[1],2.0);
        dVar12 = exp(-(dVar10 / (dVar11 * 2.0) + dVar12 / (dVar13 * 2.0)));
        pvVar2->weight = (1.0 / (dVar7 * 6.283185307179586 * dVar8)) * dVar12 * pvVar2->weight;
      }
      cur_mea_map._0_4_ = (uint)cur_mea_map + 1;
    }
    dVar12 = pvVar2->weight;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->weights,(ulong)cur_particle._4_4_);
    *pvVar6 = dVar12;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_80);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(const double sensor_range, const double std_landmark[], 
		const std::vector<LandmarkObs>& observations, const Map& map_landmarks) 
{
	// TODO: Update the weights of each particle using a mult-variate Gaussian distribution. You can read
	//   more about this distribution here: https://en.wikipedia.org/wiki/Multivariate_normal_distribution
	// NOTE: The observations are given in the VEHICLE'S coordinate system. Your particles are located
	//   according to the MAP'S coordinate system. You will need to transform between the two systems.
	//   Keep in mind that this transformation requires both rotation AND translation (but no scaling).
	//   The following is a good resource for the theory:
	//   https://www.willamette.edu/~gorr/classes/GeneralGraphics/Transforms/transforms2d.htm
	//   and the following is a good resource for the actual equation to implement (look at equation 
	//   3.33. Note that you'll need to switch the minus sign in that equation to a plus to account 
	//   for the fact that the map's y-axis actually points downwards.)
	//   http://planning.cs.uiuc.edu/node99.html
    const double sensor_range_squared = sensor_range*sensor_range;

    for (unsigned int i = 0; i < num_particles; ++i)
    {
        Particle& cur_particle        = particles[i];
        const double cosThetaParticle = std::cos(cur_particle.theta);
        const double sinThetaParticle = std::sin(cur_particle.theta);
        const double xParticle        = cur_particle.x;
        const double yParticle        = cur_particle.y;

        std::vector<LandmarkObs> meas_map;
        for (unsigned int j = 0; j < observations.size(); ++j)
        {
            const LandmarkObs& cur_meas_veh = observations[j];
            LandmarkObs cur_meas_map;

            //Transform from vehicle to map
            cur_meas_map.x = xParticle  + cur_meas_veh.x*cosThetaParticle - cur_meas_veh.y*sinThetaParticle;
            cur_meas_map.y = yParticle  + cur_meas_veh.x*sinThetaParticle + cur_meas_veh.y*cosThetaParticle;
            meas_map.push_back(cur_meas_map);
        }

        cur_particle.weight = 1.0;

        for(unsigned int j = 0; j < meas_map.size(); ++j)
        {
            const LandmarkObs& cur_mea_map = meas_map[j];
            double min_dist_squared = sensor_range_squared;
            const Map::single_landmark_s* closestLm = NULL;

            for (unsigned int k = 0; k < map_landmarks.landmark_list.size(); ++k) 
            {
                const Map::single_landmark_s& cur_lm = map_landmarks.landmark_list[k];
                const double x_lm = cur_lm.x_f;
                const double y_lm = cur_lm.y_f;

                const double cur_dist_squared = distSquared(cur_mea_map.x, cur_mea_map.y, x_lm, y_lm);
                if(cur_dist_squared < min_dist_squared)
                {
                    min_dist_squared = cur_dist_squared;
                    closestLm = &cur_lm;
                }
            }

            if(closestLm)
            {
                const double x_meas   = cur_mea_map.x;
                const double y_meas   = cur_mea_map.y;
                const double x_mu     = closestLm->x_f;
                const double y_mu     = closestLm->y_f;
                const double measProb = 1/(2.0*PI*std_landmark[0]*std_landmark[1])*std::exp(-(std::pow(x_meas-x_mu,2.0)/(2.0*pow(std_landmark[0],2.0))+pow(y_meas-y_mu,2.0)/(2.0*pow(std_landmark[1],2.0))));
                cur_particle.weight   *= measProb;
            }
        }
        weights[i] = cur_particle.weight;
    }
}